

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

void declare_types(void)

{
  int iVar1;
  ushort **ppuVar2;
  union_tag *local_20;
  union_tag *tag;
  bucket *bp;
  int c;
  
  local_20 = (union_tag *)0x0;
  bp._4_4_ = nextc();
  if (bp._4_4_ == 0x3c) {
    local_20 = get_tag(1);
    bp._4_4_ = nextc();
  }
  if (bp._4_4_ == -1) {
    unexpected_EOF();
  }
  do {
    iVar1 = nextc();
    ppuVar2 = __ctype_b_loc();
    if ((((((*ppuVar2)[iVar1] & 0x400) == 0) && (iVar1 != 0x5f)) && (iVar1 != 0x2e)) &&
       (iVar1 != 0x24)) {
      if ((iVar1 != 0x27) && (iVar1 != 0x22)) {
        return;
      }
      tag = (union_tag *)get_literal();
      ((bucket *)tag)->args = 0;
    }
    else {
      tag = (union_tag *)get_name();
      iVar1 = nextc();
      if (iVar1 == 0x28) {
        declare_argtypes((bucket *)tag);
      }
      else {
        ((bucket *)tag)->args = 0;
      }
    }
    if (local_20 != (union_tag *)0x0) {
      if ((tag[1].next != (union_tag *)0x0) && (local_20 != tag[1].next)) {
        retyped_warning((char *)tag->dtor);
      }
      tag[1].next = local_20;
    }
  } while( true );
}

Assistant:

void declare_types()
{
    register int c;
    register bucket *bp=0;
    union_tag *tag=0;

    c = nextc();
    if (c == '<') {
	tag = get_tag(1);
	c = nextc(); }
    if (c == EOF) unexpected_EOF();

    for (;;) {
	c = nextc();
	if (isalpha(c) || c == '_' || c == '.' || c == '$') {
	    bp = get_name();
	    if (nextc() == '(')
		declare_argtypes(bp);
	    else
		bp->args = 0; }
	else if (c == '\'' || c == '"') {
	    bp = get_literal();
	    bp->args = 0; }
	else
	    return;

	if (tag) {
	    if (bp->tag && tag != bp->tag)
		retyped_warning(bp->name);
	    bp->tag = tag; } }
}